

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  undefined8 uVar4;
  double dVar5;
  Atmosphere A;
  allocator<char> local_d9;
  double local_d8;
  double local_d0;
  double local_c8;
  char **local_c0;
  Atmosphere local_b8;
  
  if (argc != 4) {
LAB_00102474:
    local_d8 = 100.0;
    local_d0 = 80000.0;
    local_c8 = 0.0;
    goto LAB_0010259a;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,argv[1],&local_d9);
  uVar4 = local_b8._0_8_;
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  *piVar3 = 0;
  dVar5 = strtod((char *)uVar4,(char **)&local_c0);
  if (local_c0 == (char **)uVar4) {
    std::__throw_invalid_argument("stod");
  }
  else {
    local_c8 = dVar5;
    if (*piVar3 == 0) {
      *piVar3 = iVar1;
    }
    else if (*piVar3 == 0x22) {
      std::__throw_out_of_range("stod");
      goto LAB_00102474;
    }
    lVar2 = (long)&local_b8 + 0x10;
    if (local_b8._0_8_ != lVar2) {
      operator_delete((void *)local_b8._0_8_,(long)local_b8.height_range[1] + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,argv[2],&local_d9);
    uVar4 = local_b8._0_8_;
    iVar1 = *piVar3;
    *piVar3 = 0;
    dVar5 = strtod((char *)local_b8._0_8_,(char **)&local_c0);
    if (local_c0 != (char **)uVar4) {
      local_d0 = dVar5;
      if (*piVar3 == 0) {
LAB_00102512:
        *piVar3 = iVar1;
      }
      else if (*piVar3 == 0x22) {
        std::__throw_out_of_range("stod");
        goto LAB_00102512;
      }
      if (local_b8._0_8_ != lVar2) {
        operator_delete((void *)local_b8._0_8_,(long)local_b8.height_range[1] + 1);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,argv[3],&local_d9);
      uVar4 = local_b8._0_8_;
      iVar1 = *piVar3;
      *piVar3 = 0;
      local_d8 = strtod((char *)local_b8._0_8_,(char **)&local_c0);
      if (local_c0 == (char **)uVar4) goto LAB_00102686;
      if (*piVar3 == 0) {
LAB_00102581:
        *piVar3 = iVar1;
      }
      else if (*piVar3 == 0x22) {
        std::__throw_out_of_range("stod");
        goto LAB_00102581;
      }
      if (local_b8._0_8_ != lVar2) {
        operator_delete((void *)local_b8._0_8_,(long)local_b8.height_range[1] + 1);
      }
LAB_0010259a:
      Atmosphere::Atmosphere(&local_b8);
      Atmosphere::print_tabular(&local_b8,local_c8,local_d0,local_d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nPress Enter to Exit",0x14);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
      std::ostream::put(-0x50);
      std::ostream::flush();
      std::istream::ignore();
      std::vector<Layer,_std::allocator<Layer>_>::~vector
                ((vector<Layer,_std::allocator<Layer>_> *)((long)&local_b8 + 0x70));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&local_b8 + 0x48));
      if (local_b8.H.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.H.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b8.H.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.H.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (local_b8.T.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.T.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b8.T.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.T.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      return 0;
    }
  }
  std::__throw_invalid_argument("stod");
LAB_00102686:
  uVar4 = std::__throw_invalid_argument("stod");
  _Unwind_Resume(uVar4);
}

Assistant:

int main(int argc, char *argv[]) {

    double hmin, hmax, hstep;

    if (argc == 4) {
        hmin = std::stod(argv[1]);
        hmax = std::stod(argv[2]);
        hstep = std::stod(argv[3]);
    } else {
        hmin = 0;
        hmax = 80000.0;
        hstep = 100.0;
    }

    Atmosphere A = Atmosphere();
    A.print_tabular(hmin, hmax, hstep);

    // Just to keep console window open
    std::cout << "\nPress Enter to Exit" << std::endl;
    std::cin.ignore();

    return 0;
}